

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdDmaState::emulate_mthd(MthdDmaState *this)

{
  bool bVar1;
  uint uVar2;
  uint uStack_14;
  bool bad;
  int dcls;
  uint32_t rval;
  MthdDmaState *this_local;
  
  uStack_14 = (this->super_SingleMthdTest).super_MthdTest.val & 0xffff;
  uVar2 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.pobj[0] << 0x34) >> 0x34);
  if (uVar2 == 0x30) {
    uStack_14 = 0;
  }
  bVar1 = false;
  if (((uVar2 != 0x30) && (uVar2 != 0x3d)) && (uVar2 != 3)) {
    bVar1 = true;
  }
  if ((bVar1) &&
     ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d << 0x28)
      < 0)) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,2);
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_dma =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_dma & 0xffff |
       uStack_14 << 0x10;
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = val & 0xffff;
		int dcls = extr(pobj[0], 0, 12);
		if (dcls == 0x30)
			rval = 0;
		bool bad = false;
		if (dcls != 0x30 && dcls != 0x3d && dcls != 3)
			bad = true;
		if (bad && extr(exp.debug_d, 23, 1))
			nv04_pgraph_blowup(&exp, 2);
		insrt(exp.celsius_dma, 16, 16, rval);
	}